

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *param,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_3)

{
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_local_2;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_local_1;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *param_local;
  AsyncQueue<nrg::PrioExecution> *this_local;
  
  lock._M_device = (mutex_type *)param_3;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->guard_);
  PrioExecution::
  push<void(*)(std::ostream&,std::__cxx11::string_const&),std::reference_wrapper<std::ostream>,std::__cxx11::string>
            (&this->queue_,param,param_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }